

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::OpenPathsFromPolyTree(PolyTree *polytree,Paths *paths)

{
  bool bVar1;
  int iVar2;
  reference ppPVar3;
  int local_1c;
  int i;
  Paths *paths_local;
  PolyTree *polytree_local;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(paths,0);
  iVar2 = PolyTree::Total(polytree);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(paths,(long)iVar2);
  for (local_1c = 0; iVar2 = PolyNode::ChildCount(&polytree->super_PolyNode), local_1c < iVar2;
      local_1c = local_1c + 1) {
    ppPVar3 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[](&(polytree->super_PolyNode).Childs,(long)local_1c);
    bVar1 = PolyNode::IsOpen(*ppPVar3);
    if (bVar1) {
      ppPVar3 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                operator[](&(polytree->super_PolyNode).Childs,(long)local_1c);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::push_back(paths,&(*ppPVar3)->Contour);
    }
  }
  return;
}

Assistant:

void OpenPathsFromPolyTree(PolyTree& polytree, Paths& paths)
{
  paths.resize(0); 
  paths.reserve(polytree.Total());
  //Open paths are top level only, so ...
  for (int i = 0; i < polytree.ChildCount(); ++i)
    if (polytree.Childs[i]->IsOpen())
      paths.push_back(polytree.Childs[i]->Contour);
}